

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_unittests.cpp
# Opt level: O0

void __thiscall Matrix_Sub_Test::TestBody(Matrix_Sub_Test *this)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  AssertHelper local_158;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_5;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_4;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  int local_a4;
  size_t local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_80;
  Message local_78;
  int local_6c;
  size_t local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  Matrix<int> s;
  Matrix<int> c;
  undefined1 local_20 [8];
  Matrix<int> m;
  Matrix_Sub_Test *this_local;
  
  m.M = (int **)this;
  Matrix<int>::Matrix((Matrix<int> *)local_20,2,2);
  piVar2 = Matrix<int>::operator[]((Matrix<int> *)local_20,0);
  *piVar2 = 1;
  piVar2 = Matrix<int>::operator[]((Matrix<int> *)local_20,0);
  piVar2[1] = 2;
  piVar2 = Matrix<int>::operator[]((Matrix<int> *)local_20,1);
  *piVar2 = 3;
  piVar2 = Matrix<int>::operator[]((Matrix<int> *)local_20,1);
  piVar2[1] = 4;
  Matrix<int>::Matrix((Matrix<int> *)&s.M,(Matrix<int> *)local_20);
  Matrix<int>::operator-((Matrix<int> *)&gtest_ar.message_,(Matrix<int> *)local_20);
  local_68 = Matrix<int>::get_rows((Matrix<int> *)&gtest_ar.message_);
  local_6c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_60,"s.get_rows()","2",&local_68,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_a0 = Matrix<int>::get_columns((Matrix<int> *)&gtest_ar.message_);
    local_a4 = 2;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((EqHelper<false> *)local_98,"s.get_columns()","2",&local_a0,&local_a4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                 ,0x50,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_b0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&gtest_ar.message_,0);
      local_cc = 0;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_c8,"s[0][0]","0",piVar2,&local_cc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x51,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&gtest_ar.message_,0);
      local_f4 = 0;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_f0,"s[0][1]","0",piVar2 + 1,&local_f4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x52,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_100);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&gtest_ar.message_,1);
      local_11c = 0;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_118,"s[1][0]","0",piVar2,&local_11c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x53,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_128);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_128);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&gtest_ar.message_,1);
      local_144 = 0;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_140,"s[1][1]","0",piVar2 + 1,&local_144);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
      if (!bVar1) {
        testing::Message::Message(&local_150);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x54,pcVar3);
        testing::internal::AssertHelper::operator=(&local_158,&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        testing::Message::~Message(&local_150);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
  Matrix<int>::~Matrix((Matrix<int> *)&gtest_ar.message_);
  Matrix<int>::~Matrix((Matrix<int> *)&s.M);
  Matrix<int>::~Matrix((Matrix<int> *)local_20);
  return;
}

Assistant:

TEST(Matrix, Sub) {
  Matrix<int> m(2, 2);
  m[0][0] = 1;
  m[0][1] = 2;
  m[1][0] = 3;
  m[1][1] = 4;

  auto c = m;
  auto s = m - c;

  ASSERT_EQ(s.get_rows(), 2);
  ASSERT_EQ(s.get_columns(), 2);
  EXPECT_EQ(s[0][0], 0);
  EXPECT_EQ(s[0][1], 0);
  EXPECT_EQ(s[1][0], 0);
  EXPECT_EQ(s[1][1], 0);
}